

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb-test.cpp
# Opt level: O0

char * state_to_string(cubeb_state state)

{
  cubeb_state state_local;
  char *local_8;
  
  switch(state) {
  case CUBEB_STATE_STARTED:
    local_8 = "CUBEB_STATE_STARTED";
    break;
  case CUBEB_STATE_STOPPED:
    local_8 = "CUBEB_STATE_STOPPED";
    break;
  case CUBEB_STATE_DRAINED:
    local_8 = "CUBEB_STATE_DRAINED";
    break;
  case CUBEB_STATE_ERROR:
    local_8 = "CUBEB_STATE_ERROR";
    break;
  default:
    local_8 = "Undefined state";
  }
  return local_8;
}

Assistant:

static const char* state_to_string(cubeb_state state) {
  switch (state) {
    case CUBEB_STATE_STARTED:
      return "CUBEB_STATE_STARTED";
    case CUBEB_STATE_STOPPED:
      return "CUBEB_STATE_STOPPED";
    case CUBEB_STATE_DRAINED:
      return "CUBEB_STATE_DRAINED";
    case CUBEB_STATE_ERROR:
      return "CUBEB_STATE_ERROR";
    default:
      return "Undefined state";
  }
}